

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

void __thiscall toml::detail::region::region(region *this,location *loc)

{
  source_ptr *psVar1;
  type tVar2;
  location *loc_local;
  region *this_local;
  
  region_base::region_base(&this->super_region_base);
  (this->super_region_base)._vptr_region_base = (_func_int **)&PTR__region_00436d88;
  psVar1 = location::source(loc);
  std::shared_ptr<const_std::vector<char,_std::allocator<char>_>_>::shared_ptr
            (&this->source_,psVar1);
  location::name_abi_cxx11_(&this->source_name_,loc);
  tVar2 = location::iter(loc);
  (this->first_)._M_current = tVar2._M_current;
  tVar2 = location::iter(loc);
  (this->last_)._M_current = tVar2._M_current;
  return;
}

Assistant:

explicit region(const location& loc)
      : source_(loc.source()), source_name_(loc.name()),
        first_(loc.iter()), last_(loc.iter())
    {}